

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOBoard.cpp
# Opt level: O3

void __thiscall IOBoard::writeBoardIntoFile(IOBoard *this,Board *board,string *fileName)

{
  pointer puVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  ostream *poVar3;
  pointer puVar4;
  ofstream ofs;
  char local_229;
  long local_228;
  filebuf local_220 [24];
  byte abStack_208 [216];
  ios_base local_130 [264];
  
  std::ofstream::ofstream(&local_228,(string *)fileName,_S_out);
  if ((abStack_208[*(long *)(local_228 + -0x18)] & 5) == 0) {
    pvVar2 = Board::getBoardValues(board);
    puVar4 = (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar1 = (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar4 != puVar1) {
      do {
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
        local_229 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_229,1);
        puVar4 = puVar4 + 1;
      } while (puVar4 != puVar1);
    }
    Board::getSizeInt(board);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
    local_229 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_229,1);
    std::ofstream::close();
  }
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _connect;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void IOBoard::writeBoardIntoFile( const Board& board, const std::string& fileName )
{
    std::ofstream ofs( fileName );
    if ( !ofs )
    {
        return;
    }

    const auto& values = board.getBoardValues();
    for ( uint value : values )
    {
        ofs << value << ',';
    }
    ofs << board.getSizeInt() << '\n';
    ofs.close();
}